

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

char * __thiscall
MemoryLeakDetector::allocMemory
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,size_t size,char *file,
          size_t line,bool allocatNodesSeperately)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar3;
  MemoryLeakDetectorNode *node;
  char *pcVar2;
  
  uVar3 = size + 3 & 0xfffffffffffffff8;
  iVar1 = (*allocator->_vptr_TestMemoryAllocator[2])
                    (allocator,uVar3 + (ulong)!allocatNodesSeperately * 0x40 + 8,file,line);
  pcVar2 = (char *)CONCAT44(extraout_var,iVar1);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    if (allocatNodesSeperately) {
      iVar1 = (*allocator->_vptr_TestMemoryAllocator[8])(allocator,0x40);
      node = (MemoryLeakDetectorNode *)CONCAT44(extraout_var_00,iVar1);
    }
    else {
      node = (MemoryLeakDetectorNode *)(pcVar2 + uVar3 + 8);
    }
    storeLeakInformation(this,node,pcVar2,size,allocator,file,line);
    pcVar2 = *(char **)(node + 0x10);
  }
  return pcVar2;
}

Assistant:

char* MemoryLeakDetector::allocMemory(TestMemoryAllocator* allocator, size_t size, const char* file, size_t line, bool allocatNodesSeperately)
{
#ifdef CPPUTEST_DISABLE_MEM_CORRUPTION_CHECK
   allocatNodesSeperately = true;
#endif
    /* With malloc, it is harder to guarantee that the allocator free is called.
     * This is because operator new is overloaded via linker symbols, but malloc just via #defines.
     * If the same allocation is used and the wrong free is called, it will deallocate the memory leak information
     * without the memory leak detector ever noticing it!
     * So, for malloc, we'll allocate the memory separately so we can detect this and give a proper error.
     */

    char* memory = allocateMemoryWithAccountingInformation(allocator, size, file, line, allocatNodesSeperately);
    if (memory == NULLPTR) return NULLPTR;
    MemoryLeakDetectorNode* node = createMemoryLeakAccountingInformation(allocator, size, memory, allocatNodesSeperately);

    storeLeakInformation(node, memory, size, allocator, file, line);
    return node->memory_;
}